

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O3

Reals __thiscall Omega_h::get_complexity_per_elem(Omega_h *this,Mesh *mesh,Reals *v2m)

{
  int *piVar1;
  uint uVar2;
  LO nmetrics;
  uint uVar3;
  undefined8 uVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  Alloc *pAVar9;
  Reals RVar10;
  Reals local_a8;
  Reals local_98;
  Reals local_88;
  Reals local_78;
  Reals local_68;
  Reals local_58;
  undefined1 local_48 [32];
  void *pvVar5;
  
  pAVar9 = (v2m->write_).shared_alloc_.alloc;
  if (((ulong)pAVar9 & 1) == 0) {
    uVar7 = pAVar9->size;
  }
  else {
    uVar7 = (ulong)pAVar9 >> 3;
  }
  if ((int)(uVar7 >> 3) == 0) {
    local_48._0_8_ = (Alloc *)(local_48 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48);
    Read<double>::Read((Read<double> *)this,(initializer_list<double>)ZEXT816(0),(string *)local_48)
    ;
    pvVar5 = extraout_RDX;
    if ((Alloc *)local_48._0_8_ == (Alloc *)(local_48 + 0x10)) goto LAB_00338b64;
    uVar7 = local_48._16_8_ + 1;
    pAVar9 = (Alloc *)local_48._0_8_;
  }
  else {
    nmetrics = Mesh::nverts(mesh);
    local_58.write_.shared_alloc_.alloc = (v2m->write_).shared_alloc_.alloc;
    if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
        local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_58.write_.shared_alloc_.alloc =
             (Alloc *)((local_58.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_58.write_.shared_alloc_.alloc)->use_count =
             (local_58.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    pAVar9 = local_58.write_.shared_alloc_.alloc;
    local_58.write_.shared_alloc_.direct_ptr = (v2m->write_).shared_alloc_.direct_ptr;
    uVar3 = get_metrics_dim(nmetrics,&local_58);
    if (((ulong)pAVar9 & 7) == 0 && pAVar9 != (Alloc *)0x0) {
      piVar1 = &pAVar9->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar9);
        operator_delete(pAVar9,0x48);
      }
    }
    uVar2 = mesh->dim_;
    if (3 < uVar2) {
      pcVar8 = "0 <= dim_ && dim_ <= 3";
      pcVar6 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
      ;
      uVar4 = 0x33;
LAB_00338b91:
      fail("assertion %s failed at %s +%d\n",pcVar8,pcVar6,uVar4);
    }
    if (uVar3 == 3 && (uVar2 ^ 3) == 0) {
      local_68.write_.shared_alloc_.alloc = (v2m->write_).shared_alloc_.alloc;
      if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
          local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_68.write_.shared_alloc_.alloc =
               (Alloc *)((local_68.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_68.write_.shared_alloc_.alloc)->use_count =
               (local_68.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_68.write_.shared_alloc_.direct_ptr = (v2m->write_).shared_alloc_.direct_ptr;
      RVar10 = get_complexity_per_elem_tmpl<3,3>(this,mesh,&local_68);
      pvVar5 = RVar10.write_.shared_alloc_.direct_ptr;
      pAVar9 = local_68.write_.shared_alloc_.alloc;
    }
    else if (uVar3 == 2 && (uVar2 ^ 2) == 0) {
      local_78.write_.shared_alloc_.alloc = (v2m->write_).shared_alloc_.alloc;
      if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
          local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_78.write_.shared_alloc_.alloc =
               (Alloc *)((local_78.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_78.write_.shared_alloc_.alloc)->use_count =
               (local_78.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_78.write_.shared_alloc_.direct_ptr = (v2m->write_).shared_alloc_.direct_ptr;
      RVar10 = get_complexity_per_elem_tmpl<2,2>(this,mesh,&local_78);
      pvVar5 = RVar10.write_.shared_alloc_.direct_ptr;
      pAVar9 = local_78.write_.shared_alloc_.alloc;
    }
    else if ((uVar2 ^ 3) == 0 && (uVar3 ^ 1) == 0) {
      local_88.write_.shared_alloc_.alloc = (v2m->write_).shared_alloc_.alloc;
      if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
          local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_88.write_.shared_alloc_.alloc =
               (Alloc *)((local_88.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_88.write_.shared_alloc_.alloc)->use_count =
               (local_88.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_88.write_.shared_alloc_.direct_ptr = (v2m->write_).shared_alloc_.direct_ptr;
      RVar10 = get_complexity_per_elem_tmpl<3,1>(this,mesh,&local_88);
      pvVar5 = RVar10.write_.shared_alloc_.direct_ptr;
      pAVar9 = local_88.write_.shared_alloc_.alloc;
    }
    else if ((uVar3 ^ 1) == 0 && (uVar2 ^ 2) == 0) {
      local_98.write_.shared_alloc_.alloc = (v2m->write_).shared_alloc_.alloc;
      if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
          local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_98.write_.shared_alloc_.alloc =
               (Alloc *)((local_98.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_98.write_.shared_alloc_.alloc)->use_count =
               (local_98.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_98.write_.shared_alloc_.direct_ptr = (v2m->write_).shared_alloc_.direct_ptr;
      RVar10 = get_complexity_per_elem_tmpl<2,1>(this,mesh,&local_98);
      pvVar5 = RVar10.write_.shared_alloc_.direct_ptr;
      pAVar9 = local_98.write_.shared_alloc_.alloc;
    }
    else {
      if (uVar2 != 1) {
        pcVar8 = "false";
        pcVar6 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric.cpp"
        ;
        uVar4 = 0x1f2;
        goto LAB_00338b91;
      }
      local_a8.write_.shared_alloc_.alloc = (v2m->write_).shared_alloc_.alloc;
      if (((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
          local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_a8.write_.shared_alloc_.alloc =
               (Alloc *)((local_a8.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_a8.write_.shared_alloc_.alloc)->use_count =
               (local_a8.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_a8.write_.shared_alloc_.direct_ptr = (v2m->write_).shared_alloc_.direct_ptr;
      RVar10 = get_complexity_per_elem_tmpl<1,1>(this,mesh,&local_a8);
      pvVar5 = RVar10.write_.shared_alloc_.direct_ptr;
      pAVar9 = local_a8.write_.shared_alloc_.alloc;
    }
    if (((ulong)pAVar9 & 7) != 0 || pAVar9 == (Alloc *)0x0) goto LAB_00338b64;
    piVar1 = &pAVar9->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) goto LAB_00338b64;
    Alloc::~Alloc(pAVar9);
    uVar7 = 0x48;
  }
  operator_delete(pAVar9,uVar7);
  pvVar5 = extraout_RDX_00;
LAB_00338b64:
  RVar10.write_.shared_alloc_.direct_ptr = pvVar5;
  RVar10.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar10.write_.shared_alloc_;
}

Assistant:

Reals get_complexity_per_elem(Mesh* mesh, Reals v2m) {
  if (v2m.size() == 0) return Reals({});
  auto metric_dim = get_metrics_dim(mesh->nverts(), v2m);
  if (mesh->dim() == 3 && metric_dim == 3) {
    return get_complexity_per_elem_tmpl<3, 3>(mesh, v2m);
  } else if (mesh->dim() == 2 && metric_dim == 2) {
    return get_complexity_per_elem_tmpl<2, 2>(mesh, v2m);
  } else if (mesh->dim() == 3 && metric_dim == 1) {
    return get_complexity_per_elem_tmpl<3, 1>(mesh, v2m);
  } else if (mesh->dim() == 2 && metric_dim == 1) {
    return get_complexity_per_elem_tmpl<2, 1>(mesh, v2m);
  } else if (mesh->dim() == 1) {
    return get_complexity_per_elem_tmpl<1, 1>(mesh, v2m);
  }
  OMEGA_H_NORETURN(Reals());
}